

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

int ov_pcm_seek_page(OggVorbis_File *vf,ogg_int64_t pos)

{
  int iVar1;
  long lVar2;
  ogg_int64_t oVar3;
  ulong uVar4;
  undefined1 local_f0 [8];
  ogg_packet op;
  ogg_page og_1;
  ogg_int64_t granulepos;
  ogg_int64_t bisect;
  ogg_page og;
  ogg_int64_t oStack_68;
  int got_page;
  ogg_int64_t best;
  ogg_int64_t target;
  ogg_int64_t endtime;
  ogg_int64_t begintime;
  ogg_int64_t begin;
  ogg_int64_t end;
  ogg_int64_t total;
  ogg_int64_t result;
  int link;
  ogg_int64_t pos_local;
  OggVorbis_File *vf_local;
  
  total = 0;
  end = ov_pcm_total(vf,-1);
  if (vf->ready_state < 2) {
    return -0x83;
  }
  if (vf->seekable == 0) {
    return -0x8a;
  }
  if ((pos < 0) || (end < pos)) {
    return -0x83;
  }
  result._4_4_ = vf->links;
  do {
    iVar1 = result._4_4_;
    result._4_4_ = iVar1 + -1;
    if (result._4_4_ < 0) break;
    end = end - vf->pcmlengths[result._4_4_ * 2 + 1];
  } while (pos < end);
  begin = vf->offsets[iVar1];
  begintime = vf->dataoffsets[result._4_4_];
  endtime = vf->pcmlengths[result._4_4_ * 2];
  target = vf->pcmlengths[result._4_4_ * 2 + 1] + endtime;
  lVar2 = (pos - end) + endtime;
  oStack_68 = -1;
  og.body_len._4_4_ = 0;
  if (begintime == begin) {
    iVar1 = _seek_helper(vf,begintime);
    total = (ogg_int64_t)iVar1;
    if ((total != 0) || (total = _get_next_page(vf,(ogg_page *)&bisect,1), total < 0))
    goto LAB_002512b2;
    og.body_len._4_4_ = 1;
  }
LAB_00250c38:
  if (begintime < begin) {
    if (begin - begintime < 0x10000) {
      granulepos = begintime;
    }
    else {
      granulepos = begintime +
                   (long)(((double)(lVar2 - endtime) * (double)(begin - begintime)) /
                         (double)(target - endtime)) + -0x10000;
      if (granulepos < begintime + 0x10000) {
        granulepos = begintime;
      }
    }
    iVar1 = _seek_helper(vf,granulepos);
joined_r0x00250cea:
    do {
      total = (ogg_int64_t)iVar1;
      if (total != 0) goto LAB_002512b2;
      while( true ) {
        while( true ) {
          if (begin <= begintime) goto LAB_00250c38;
          total = _get_next_page(vf,(ogg_page *)&bisect,begin - vf->offset);
          if (total == -0x80) goto LAB_002512b2;
          if (total < 0) break;
          og.body_len._4_4_ = 1;
          iVar1 = ogg_page_serialno((ogg_page *)&bisect);
          if (((long)iVar1 == vf->serialnos[result._4_4_]) &&
             (oVar3 = ogg_page_granulepos((ogg_page *)&bisect), oVar3 != -1)) {
            if (oVar3 < lVar2) {
              granulepos = vf->offset;
              oStack_68 = total;
              endtime = oVar3;
              begintime = granulepos;
              if (0xac44 < lVar2 - oVar3) goto LAB_00250c38;
            }
            else {
              if (begintime + 1 < granulepos) {
                if (begin != vf->offset) {
                  begin = granulepos;
                  target = oVar3;
                  goto LAB_00250c38;
                }
                granulepos = granulepos + -0x10000;
                if (granulepos <= begintime) {
                  granulepos = begintime + 1;
                }
                iVar1 = _seek_helper(vf,granulepos);
                begin = total;
                goto joined_r0x00250cea;
              }
              begin = begintime;
            }
          }
        }
        if (begintime + 1 < granulepos) break;
        begin = begintime;
      }
      if (granulepos == 0) goto LAB_002512b2;
      granulepos = granulepos + -0x10000;
      if (granulepos <= begintime) {
        granulepos = begintime + 1;
      }
      iVar1 = _seek_helper(vf,granulepos);
    } while( true );
  }
  if (oStack_68 == -1) {
    if (((og.body_len._4_4_ == 0) || (begintime != vf->dataoffsets[result._4_4_])) ||
       (iVar1 = ogg_page_serialno((ogg_page *)&bisect), (long)iVar1 != vf->serialnos[result._4_4_]))
    goto LAB_002512b2;
    vf->pcm_offset = end;
    if (result._4_4_ == vf->current_link) {
      vorbis_synthesis_restart(&vf->vd);
    }
    else {
      _decode_clear(vf);
      vf->current_link = result._4_4_;
      vf->current_serialno = vf->serialnos[result._4_4_];
      vf->ready_state = 3;
    }
    ogg_stream_reset_serialno(&vf->os,(int)vf->current_serialno);
    ogg_stream_pagein(&vf->os,(ogg_page *)&bisect);
  }
  else {
    iVar1 = _seek_helper(vf,oStack_68);
    total = (ogg_int64_t)iVar1;
    vf->pcm_offset = -1;
    if ((total != 0) || (total = _get_next_page(vf,(ogg_page *)&op.packetno,-1), total < 0))
    goto LAB_002512b2;
    if (result._4_4_ == vf->current_link) {
      vorbis_synthesis_restart(&vf->vd);
    }
    else {
      _decode_clear(vf);
      vf->current_link = result._4_4_;
      vf->current_serialno = vf->serialnos[result._4_4_];
      vf->ready_state = 3;
    }
    ogg_stream_reset_serialno(&vf->os,(int)vf->current_serialno);
    ogg_stream_pagein(&vf->os,(ogg_page *)&op.packetno);
    while( true ) {
      iVar1 = ogg_stream_packetpeek(&vf->os,(ogg_packet *)local_f0);
      total = (ogg_int64_t)iVar1;
      if (total == 0) {
        total = oStack_68;
        while (vf->dataoffsets[result._4_4_] < total) {
          total = _get_prev_page(vf,total,(ogg_page *)&op.packetno);
          if (total < 0) goto LAB_002512b2;
          iVar1 = ogg_page_serialno((ogg_page *)&op.packetno);
          if (((long)iVar1 == vf->current_serialno) &&
             ((uVar4 = ogg_page_granulepos((ogg_page *)&op.packetno), uVar4 < 0x8000000000000000 ||
              (iVar1 = ogg_page_continued((ogg_page *)&op.packetno), iVar1 == 0)))) {
            iVar1 = ov_raw_seek(vf,total);
            return iVar1;
          }
        }
      }
      if (total < 0) {
        total = -0x88;
        goto LAB_002512b2;
      }
      if (op.e_o_s != -1) break;
      ogg_stream_packetout(&vf->os,(ogg_packet *)0x0);
    }
    vf->pcm_offset = op.e_o_s - vf->pcmlengths[vf->current_link << 1];
    if (vf->pcm_offset < 0) {
      vf->pcm_offset = 0;
    }
    vf->pcm_offset = end + vf->pcm_offset;
  }
  if ((vf->pcm_offset <= pos) && (oVar3 = ov_pcm_total(vf,-1), pos <= oVar3)) {
    vf->bittrack = 0.0;
    vf->samptrack = 0.0;
    return 0;
  }
  total = -0x81;
LAB_002512b2:
  vf->pcm_offset = -1;
  _decode_clear(vf);
  return (int)total;
}

Assistant:

int ov_pcm_seek_page(OggVorbis_File *vf,ogg_int64_t pos){
  int link=-1;
  ogg_int64_t result=0;
  ogg_int64_t total=ov_pcm_total(vf,-1);

  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(!vf->seekable)return(OV_ENOSEEK);

  if(pos<0 || pos>total)return(OV_EINVAL);

  /* which bitstream section does this pcm offset occur in? */
  for(link=vf->links-1;link>=0;link--){
    total-=vf->pcmlengths[link*2+1];
    if(pos>=total)break;
  }

  /* Search within the logical bitstream for the page with the highest
     pcm_pos preceding pos.  If we're looking for a position on the
     first page, bisection will halt without finding our position as
     it's before the first explicit granulepos fencepost. That case is
     handled separately below.

     There is a danger here; missing pages or incorrect frame number
     information in the bitstream could make our task impossible.
     Account for that (it would be an error condition) */

  /* new search algorithm originally by HB (Nicholas Vinen) */

  {
    ogg_int64_t end=vf->offsets[link+1];
    ogg_int64_t begin=vf->dataoffsets[link];
    ogg_int64_t begintime = vf->pcmlengths[link*2];
    ogg_int64_t endtime = vf->pcmlengths[link*2+1]+begintime;
    ogg_int64_t target=pos-total+begintime;
    ogg_int64_t best=-1;
    int         got_page=0;

    ogg_page og;

    /* if we have only one page, there will be no bisection.  Grab the page here */
    if(begin==end){
      result=_seek_helper(vf,begin);
      if(result) goto seek_error;

      result=_get_next_page(vf,&og,1);
      if(result<0) goto seek_error;

      got_page=1;
    }

    /* bisection loop */
    while(begin<end){
      ogg_int64_t bisect;

      if(end-begin<CHUNKSIZE){
        bisect=begin;
      }else{
        /* take a (pretty decent) guess. */
        bisect=begin +
          (ogg_int64_t)((double)(target-begintime)*(end-begin)/(endtime-begintime))
          - CHUNKSIZE;
        if(bisect<begin+CHUNKSIZE)
          bisect=begin;
      }

      result=_seek_helper(vf,bisect);
      if(result) goto seek_error;

      /* read loop within the bisection loop */
      while(begin<end){
        result=_get_next_page(vf,&og,end-vf->offset);
        if(result==OV_EREAD) goto seek_error;
        if(result<0){
          /* there is no next page! */
          if(bisect<=begin+1)
              /* No bisection left to perform.  We've either found the
                 best candidate already or failed. Exit loop. */
            end=begin;
          else{
            /* We tried to load a fraction of the last page; back up a
               bit and try to get the whole last page */
            if(bisect==0) goto seek_error;
            bisect-=CHUNKSIZE;

            /* don't repeat/loop on a read we've already performed */
            if(bisect<=begin)bisect=begin+1;

            /* seek and cntinue bisection */
            result=_seek_helper(vf,bisect);
            if(result) goto seek_error;
          }
        }else{
          ogg_int64_t granulepos;
          got_page=1;

          /* got a page. analyze it */
          /* only consider pages from primary vorbis stream */
          if(ogg_page_serialno(&og)!=vf->serialnos[link])
            continue;

          /* only consider pages with the granulepos set */
          granulepos=ogg_page_granulepos(&og);
          if(granulepos==-1)continue;

          if(granulepos<target){
            /* this page is a successful candidate! Set state */

            best=result;  /* raw offset of packet with granulepos */
            begin=vf->offset; /* raw offset of next page */
            begintime=granulepos;

            /* if we're before our target but within a short distance,
               don't bisect; read forward */
            if(target-begintime>44100)break;

            bisect=begin; /* *not* begin + 1 as above */
          }else{

            /* This is one of our pages, but the granpos is
               post-target; it is not a bisection return
               candidate. (The only way we'd use it is if it's the
               first page in the stream; we handle that case later
               outside the bisection) */
            if(bisect<=begin+1){
              /* No bisection left to perform.  We've either found the
                 best candidate already or failed. Exit loop. */
              end=begin;
            }else{
              if(end==vf->offset){
                /* bisection read to the end; use the known page
                   boundary (result) to update bisection, back up a
                   little bit, and try again */
                end=result;
                bisect-=CHUNKSIZE;
                if(bisect<=begin)bisect=begin+1;
                result=_seek_helper(vf,bisect);
                if(result) goto seek_error;
              }else{
                /* Normal bisection */
                end=bisect;
                endtime=granulepos;
                break;
              }
            }
          }
        }
      }
    }

    /* Out of bisection: did it 'fail?' */
    if(best == -1){

      /* Check the 'looking for data in first page' special case;
         bisection would 'fail' because our search target was before the
         first PCM granule position fencepost. */

      if(got_page &&
         begin == vf->dataoffsets[link] &&
         ogg_page_serialno(&og)==vf->serialnos[link]){

        /* Yes, this is the beginning-of-stream case. We already have
           our page, right at the beginning of PCM data.  Set state
           and return. */

        vf->pcm_offset=total;

        if(link!=vf->current_link){
          /* Different link; dump entire decode machine */
          _decode_clear(vf);

          vf->current_link=link;
          vf->current_serialno=vf->serialnos[link];
          vf->ready_state=STREAMSET;

        }else{
          vorbis_synthesis_restart(&vf->vd);
        }

        ogg_stream_reset_serialno(&vf->os,vf->current_serialno);
        ogg_stream_pagein(&vf->os,&og);

      }else
        goto seek_error;

    }else{

      /* Bisection found our page. seek to it, update pcm offset. Easier case than
         raw_seek, don't keep packets preceding granulepos. */

      ogg_page og;
      ogg_packet op;

      /* seek */
      result=_seek_helper(vf,best);
      vf->pcm_offset=-1;
      if(result) goto seek_error;
      result=_get_next_page(vf,&og,-1);
      if(result<0) goto seek_error;

      if(link!=vf->current_link){
        /* Different link; dump entire decode machine */
        _decode_clear(vf);

        vf->current_link=link;
        vf->current_serialno=vf->serialnos[link];
        vf->ready_state=STREAMSET;

      }else{
        vorbis_synthesis_restart(&vf->vd);
      }

      ogg_stream_reset_serialno(&vf->os,vf->current_serialno);
      ogg_stream_pagein(&vf->os,&og);

      /* pull out all but last packet; the one with granulepos */
      while(1){
        result=ogg_stream_packetpeek(&vf->os,&op);
        if(result==0){
          /* No packet returned; we exited the bisection with 'best'
             pointing to a page with a granule position, so the packet
             finishing this page ('best') originated on a preceding
             page. Keep fetching previous pages until we get one with
             a granulepos or without the 'continued' flag set.  Then
             just use raw_seek for simplicity. */
          /* Do not rewind past the beginning of link data; if we do,
             it's either a bug or a broken stream */
          result=best;
          while(result>vf->dataoffsets[link]){
            result=_get_prev_page(vf,result,&og);
            if(result<0) goto seek_error;
            if(ogg_page_serialno(&og)==vf->current_serialno &&
               (ogg_page_granulepos(&og)>-1 ||
                !ogg_page_continued(&og))){
              return ov_raw_seek(vf,result);
            }
          }
        }
        if(result<0){
          result = OV_EBADPACKET;
          goto seek_error;
        }
        if(op.granulepos!=-1){
          vf->pcm_offset=op.granulepos-vf->pcmlengths[vf->current_link*2];
          if(vf->pcm_offset<0)vf->pcm_offset=0;
          vf->pcm_offset+=total;
          break;
        }else
          result=ogg_stream_packetout(&vf->os,NULL);
      }
    }
  }

  /* verify result */
  if(vf->pcm_offset>pos || pos>ov_pcm_total(vf,-1)){
    result=OV_EFAULT;
    goto seek_error;
  }
  vf->bittrack=0.f;
  vf->samptrack=0.f;
  return(0);

 seek_error:
  /* dump machine so we're in a known state */
  vf->pcm_offset=-1;
  _decode_clear(vf);
  return (int)result;
}